

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O0

void __thiscall w3Module::read_globals(w3Module *this,uint8_t **cursor)

{
  w3GlobalType wVar1;
  uint32_t uVar2;
  Global *__new_size;
  reference pvVar3;
  Global *a;
  size_t i;
  size_t size;
  uint8_t **cursor_local;
  w3Module *this_local;
  
  uVar2 = read_varuint32(this,cursor);
  __new_size = (Global *)(ulong)uVar2;
  printf("reading globals6 size:%lX\n",__new_size);
  std::vector<Global,_std::allocator<Global>_>::resize(&this->globals,(size_type)__new_size);
  for (a = (Global *)0x0; a < __new_size; a = (Global *)&(a->global_type).is_mutable) {
    pvVar3 = std::vector<Global,_std::allocator<Global>_>::operator[](&this->globals,(size_type)a);
    wVar1 = read_globaltype(this,cursor);
    pvVar3->global_type = wVar1;
    printf("read_globals %lX:%lX value_type:%X  mutable:%X init:%p\n",a,__new_size,
           (ulong)(pvVar3->global_type).value_type,(ulong)((pvVar3->global_type).is_mutable & 1),
           *cursor);
    DecodeInstructions(this,&pvVar3->init,cursor,(w3Code *)0x0);
  }
  printf("read globals6 size:%lX\n",__new_size);
  return;
}

Assistant:

void w3Module::read_globals (uint8_t** cursor)
{
    //printf ("reading section 6\n");
    const size_t size = read_varuint32 (cursor);
    printf ("reading globals6 size:%" FORMAT_SIZE "X\n", size);
    globals.resize (size);
    for (size_t i = 0; i < size; ++i)
    {
        Global& a = globals [i];
        a.global_type = read_globaltype (cursor);
        printf ("read_globals %" FORMAT_SIZE "X:%" FORMAT_SIZE "X value_type:%X  mutable:%X init:%p\n", i, size, a.global_type.value_type, a.global_type.is_mutable, *cursor);
        DecodeInstructions (this, a.init, cursor, 0);
        // Init points to code -- Instructions until end of block 0x0B Instruction.
    }
    printf ("read globals6 size:%" FORMAT_SIZE "X\n", size);
}